

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

TemplateCache * __thiscall
ctemplate::TemplateCache::template_root_directory_abi_cxx11_(TemplateCache *this)

{
  bool bVar1;
  const_reference pvVar2;
  long in_RSI;
  allocator local_21;
  ReaderMutexLock local_20;
  ReaderMutexLock ml;
  TemplateCache *this_local;
  
  ReaderMutexLock::ReaderMutexLock(&local_20,*(Mutex **)(in_RSI + 0x38));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(in_RSI + 0x10));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"./",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RSI + 0x10),0);
    std::__cxx11::string::string((string *)this,(string *)pvVar2);
  }
  ReaderMutexLock::~ReaderMutexLock(&local_20);
  return this;
}

Assistant:

string TemplateCache::template_root_directory() const {
  ReaderMutexLock ml(search_path_mutex_);
  if (search_path_.empty()) {
    return kCWD;
  }
  return search_path_[0];
}